

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void __thiscall Block::WriteFile(Block *this)

{
  byte bVar1;
  _Ios_Openmode __a;
  ostream *poVar2;
  fpos<__mbstate_t> local_230 [2];
  string local_210 [8];
  ofstream out;
  Block *this_local;
  
  std::ofstream::ofstream(local_210);
  __a = std::operator|(_S_out,_S_in);
  std::operator|(__a,_S_bin);
  std::ofstream::open(local_210,(_Ios_Openmode)this);
  bVar1 = std::ios::bad();
  if ((bVar1 & 1) == 0) {
    std::fpos<__mbstate_t>::fpos(local_230,(long)(this->FileOff << 0xd));
    std::ostream::seekp(local_210,local_230[0]._M_off,local_230[0]._M_state);
    std::ostream::write((char *)local_210,(long)this->data);
    std::ofstream::close();
    std::ofstream::~ofstream(local_210);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)this);
  poVar2 = std::operator<<(poVar2,": No such a file!");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  system("pause");
  exit(1);
}

Assistant:

void Block::WriteFile(void) {
	ofstream out;
	out.open(this->FileName, ios::out | ios::in | ios::binary);
    if (out.bad()) {
        cout << this->FileName << ": No such a file!" << endl;
        system("pause");
        exit(1);
    }
	out.seekp(this->FileOff * BLOCK_SIZE);
	//cout << out.tellp() << endl;
	out.write(reinterpret_cast<char*>(this->data), BLOCK_SIZE);
	out.close();
}